

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::version(ostream *os)

{
  ostream *poVar1;
  string local_30 [32];
  
  poVar1 = std::operator<<(os,"lest version ");
  poVar1 = std::operator<<(poVar1,"1.35.1");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Compiled with ");
  compiler_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," on ");
  poVar1 = std::operator<<(poVar1,"Apr 26 2025");
  poVar1 = std::operator<<(poVar1," at ");
  poVar1 = std::operator<<(poVar1,"23:27:03");
  poVar1 = std::operator<<(poVar1,".\n");
  std::operator<<(poVar1,"For more information, see https://github.com/martinmoene/lest.\n");
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

inline int version( std::ostream & os )
{
    os << "lest version "  << lest_VERSION << "\n"
       << "Compiled with " << compiler()   << " on " << __DATE__ << " at " << __TIME__ << ".\n"
       << "For more information, see https://github.com/martinmoene/lest.\n";
    return 0;
}